

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_mprintf(char *zFormat,...)

{
  long lVar1;
  int iVar2;
  char *in_RSI;
  long in_FS_OFFSET;
  char *z;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff08;
  char *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    local_30 = sqlite3_vmprintf(in_RSI,in_stack_ffffffffffffff08);
  }
  else {
    local_30 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API char *sqlite3_mprintf(const char *zFormat, ...){
  va_list ap;
  char *z;
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return 0;
#endif
  va_start(ap, zFormat);
  z = sqlite3_vmprintf(zFormat, ap);
  va_end(ap);
  return z;
}